

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::android::testNoUnknownExtensions
          (TestStatus *__return_storage_ptr__,Context *context)

{
  bool bVar1;
  qpTestResult code;
  TestContext *this;
  TestLog *log_00;
  PlatformInterface *pPVar2;
  InstanceInterface *pIVar3;
  VkPhysicalDevice pVVar4;
  pointer pVVar5;
  string local_210;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> local_1f0;
  __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
  local_1d8;
  __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
  local_1d0;
  const_iterator layer_1;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> layers_1;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> local_198;
  __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
  local_180;
  __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
  local_178;
  const_iterator layer;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> layers;
  allocator<char> local_129;
  value_type local_128;
  undefined1 local_108 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedDeviceExtensions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedInstanceExtensions;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  ResultCollector results;
  TestLog *log;
  Context *context_local;
  
  this = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(this);
  results.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_70,log_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&allowedDeviceExtensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"VK_GOOGLE_display_timing",&local_129);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_108,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  pPVar2 = Context::getPlatformInterface(context);
  ::vk::enumerateInstanceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &layers.
              super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,pPVar2,(char *)0x0);
  checkExtensions((ResultCollector *)local_70,
                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&allowedDeviceExtensions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
                  &layers.
                   super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::~vector
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &layers.
              super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pPVar2 = Context::getPlatformInterface(context);
  ::vk::enumerateInstanceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer,pPVar2)
  ;
  local_178._M_current =
       (VkLayerProperties *)
       std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::begin
                 ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer);
  while( true ) {
    local_180._M_current =
         (VkLayerProperties *)
         std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::end
                   ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_178,&local_180);
    if (!bVar1) break;
    pPVar2 = Context::getPlatformInterface(context);
    pVVar5 = __gnu_cxx::
             __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
             ::operator->(&local_178);
    ::vk::enumerateInstanceExtensionProperties(&local_198,pPVar2,pVVar5->layerName);
    checkExtensions((ResultCollector *)local_70,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&allowedDeviceExtensions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    &local_198);
    std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::~vector
              (&local_198);
    __gnu_cxx::
    __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
    ::operator++(&local_178);
  }
  std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::~vector
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer);
  pIVar3 = Context::getInstanceInterface(context);
  pVVar4 = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &layers_1.
              super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,pIVar3,pVVar4,(char *)0x0);
  checkExtensions((ResultCollector *)local_70,
                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108,
                  (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
                  &layers_1.
                   super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::~vector
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &layers_1.
              super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pIVar3 = Context::getInstanceInterface(context);
  pVVar4 = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer_1,
             pIVar3,pVVar4);
  local_1d0._M_current =
       (VkLayerProperties *)
       std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::begin
                 ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer_1)
  ;
  while( true ) {
    local_1d8._M_current =
         (VkLayerProperties *)
         std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::end
                   ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
                    &layer_1);
    bVar1 = __gnu_cxx::operator!=(&local_1d0,&local_1d8);
    if (!bVar1) break;
    pIVar3 = Context::getInstanceInterface(context);
    pVVar4 = Context::getPhysicalDevice(context);
    pVVar5 = __gnu_cxx::
             __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
             ::operator->(&local_1d0);
    ::vk::enumerateDeviceExtensionProperties(&local_1f0,pIVar3,pVVar4,pVVar5->layerName);
    checkExtensions((ResultCollector *)local_70,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_108,&local_1f0);
    std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::~vector
              (&local_1f0);
    __gnu_cxx::
    __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
    ::operator++(&local_1d0);
  }
  std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::~vector
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer_1);
  code = tcu::ResultCollector::getResult((ResultCollector *)local_70);
  tcu::ResultCollector::getMessage_abi_cxx11_(&local_210,(ResultCollector *)local_70);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_108);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&allowedDeviceExtensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testNoUnknownExtensions (Context& context)
{
	TestLog&				log					= context.getTestContext().getLog();
	tcu::ResultCollector	results				(log);
	set<string>				allowedInstanceExtensions;
	set<string>				allowedDeviceExtensions;

	// All known extensions should be added to allowedExtensions:
	// allowedExtensions.insert("VK_GOOGLE_extension1");
	allowedDeviceExtensions.insert("VK_GOOGLE_display_timing");

	// Instance extensions
	checkExtensions(results,
					allowedInstanceExtensions,
					enumerateInstanceExtensionProperties(context.getPlatformInterface(), DE_NULL));

	// Extensions exposed by instance layers
	{
		const vector<VkLayerProperties>	layers	= enumerateInstanceLayerProperties(context.getPlatformInterface());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
		{
			checkExtensions(results,
							allowedInstanceExtensions,
							enumerateInstanceExtensionProperties(context.getPlatformInterface(), layer->layerName));
		}
	}

	// Device extensions
	checkExtensions(results,
					allowedDeviceExtensions,
					enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), DE_NULL));

	// Extensions exposed by device layers
	{
		const vector<VkLayerProperties>	layers	= enumerateDeviceLayerProperties(context.getInstanceInterface(), context.getPhysicalDevice());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
		{
			checkExtensions(results,
							allowedDeviceExtensions,
							enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), layer->layerName));
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}